

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::IsProjectFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  allocator<char> local_9c;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,filename,&local_99);
  psVar3 = GetHomeDirectory_abi_cxx11_(this);
  bVar1 = cmsys::SystemTools::IsSubDirectory(&local_38,psVar3);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,filename,&local_9a);
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    bVar1 = cmsys::SystemTools::IsSubDirectory(&local_58,psVar3);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,filename,&local_9b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"/CMakeFiles",&local_9c);
      bVar2 = cmsys::SystemTools::IsSubDirectory(&local_78,&local_98);
      bVar2 = !bVar2;
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

bool cmMakefile::IsProjectFile(const char* filename) const
{
  return cmSystemTools::IsSubDirectory(filename, this->GetHomeDirectory()) ||
    (cmSystemTools::IsSubDirectory(filename, this->GetHomeOutputDirectory()) &&
     !cmSystemTools::IsSubDirectory(filename, "/CMakeFiles"));
}